

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fBasicComputeShaderTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles31::Functional::anon_unknown_2::SharedVarAtomicOpCase::iterate
          (SharedVarAtomicOpCase *this)

{
  size_type *this_00;
  RenderContext *renderCtx;
  Functions *gl;
  int iVar1;
  ContextType type;
  GLSLVersion version;
  GLuint GVar2;
  deUint32 dVar3;
  GLenum GVar4;
  undefined4 extraout_var;
  char *pcVar5;
  ostream *poVar6;
  ProgramSources *sources;
  TestError *pTVar7;
  ulong uVar8;
  ulong uVar9;
  int iVar10;
  int iVar11;
  long lVar12;
  int iVar13;
  uint uVar14;
  int iVar15;
  allocator<char> local_4c1;
  Functions *local_4c0;
  int local_4b4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4b0;
  Buffer outputBuffer;
  BufferMemMap bufMap;
  undefined1 local_460 [40];
  string local_438;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_418;
  ShaderProgram program;
  InterfaceVariableInfo valueInfo;
  ostringstream src;
  
  iVar1 = (*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[3])();
  local_4c0 = (Functions *)CONCAT44(extraout_var,iVar1);
  glu::TypedObjectWrapper<(glu::ObjectType)1>::TypedObjectWrapper
            (&outputBuffer,((this->super_TestCase).m_context)->m_renderCtx);
  iVar1 = (this->m_localSize).m_data[0];
  iVar13 = (this->m_localSize).m_data[1];
  iVar15 = (this->m_workSize).m_data[1] * (this->m_workSize).m_data[0] *
           (this->m_workSize).m_data[2];
  iVar10 = (this->m_localSize).m_data[2];
  type.super_ApiType.m_bits =
       (ApiType)(*((this->super_TestCase).m_context)->m_renderCtx->_vptr_RenderContext[2])();
  version = glu::getContextTypeGLSLVersion(type);
  std::__cxx11::ostringstream::ostringstream((ostringstream *)&src);
  pcVar5 = glu::getGLSLVersionDeclaration(version);
  poVar6 = std::operator<<(&src.super_basic_ostream<char,_std::char_traits<char>_>,pcVar5);
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"layout (local_size_x = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->m_localSize).m_data[0]);
  poVar6 = std::operator<<(poVar6,", local_size_y = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->m_localSize).m_data[1]);
  poVar6 = std::operator<<(poVar6,", local_size_z = ");
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,(this->m_localSize).m_data[2]);
  poVar6 = std::operator<<(poVar6,") in;\n");
  poVar6 = std::operator<<(poVar6,"layout(binding = 0) buffer Output {\n");
  poVar6 = std::operator<<(poVar6,"    uint values[");
  uVar14 = iVar13 * iVar1 * iVar10;
  poVar6 = (ostream *)std::ostream::operator<<(poVar6,iVar15 * uVar14);
  poVar6 = std::operator<<(poVar6,"];\n");
  poVar6 = std::operator<<(poVar6,"} sb_out;\n\n");
  poVar6 = std::operator<<(poVar6,"shared uint count;\n\n");
  poVar6 = std::operator<<(poVar6,"void main (void) {\n");
  poVar6 = std::operator<<(poVar6,
                           "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
                          );
  poVar6 = std::operator<<(poVar6,
                           "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
                          );
  poVar6 = std::operator<<(poVar6,"    uint globalOffs = localSize*globalNdx;\n");
  poVar6 = std::operator<<(poVar6,"\n");
  poVar6 = std::operator<<(poVar6,"    count = 0u;\n");
  poVar6 = std::operator<<(poVar6,"    barrier();\n");
  poVar6 = std::operator<<(poVar6,"    uint oldVal = atomicAdd(count, 1u);\n");
  poVar6 = std::operator<<(poVar6,"    sb_out.values[globalOffs+oldVal] = oldVal+1u;\n");
  std::operator<<(poVar6,"}\n");
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  memset(&valueInfo,0,0xac);
  std::__cxx11::stringbuf::str();
  local_460._0_4_ = SHADERTYPE_COMPUTE;
  std::__cxx11::string::string((string *)(local_460 + 8),(string *)&local_4b0);
  sources = glu::ProgramSources::operator<<((ProgramSources *)&valueInfo,(ShaderSource *)local_460);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,sources);
  std::__cxx11::string::~string((string *)(local_460 + 8));
  std::__cxx11::string::~string((string *)&local_4b0);
  glu::ProgramSources::~ProgramSources((ProgramSources *)&valueInfo);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  gl = local_4c0;
  if (program.m_program.m_info.linkOk == false) {
    pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
    tcu::TestError::TestError
              (pTVar7,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
               ,0x3ba);
    __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  valueInfo.name._M_dataplus._M_p =
       (pointer)((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log;
  this_00 = &valueInfo.name._M_string_length;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
  std::operator<<((ostream *)this_00,"Work groups: ");
  tcu::operator<<((ostream *)this_00,&this->m_workSize);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)&valueInfo,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)this_00);
  (*gl->useProgram)(program.m_program.m_program);
  GVar2 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Output");
  dVar3 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92e6,GVar2,0x9303);
  (*gl->bindBuffer)(0x90d2,outputBuffer.super_ObjectWrapper.m_object);
  (*gl->bufferData)(0x90d2,(long)(int)dVar3,(void *)0x0,0x88e1);
  (*gl->bindBufferBase)(0x90d2,0,outputBuffer.super_ObjectWrapper.m_object);
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"Output buffer setup failed",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x3c8);
  (*gl->dispatchCompute)
            ((this->m_workSize).m_data[0],(this->m_workSize).m_data[1],(this->m_workSize).m_data[2])
  ;
  GVar4 = (*gl->getError)();
  glu::checkError(GVar4,"glDispatchCompute()",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles31/functional/es31fBasicComputeShaderTests.cpp"
                  ,0x3cd);
  GVar2 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e6,"Output");
  dVar3 = glu::getProgramResourceUint(gl,program.m_program.m_program,0x92e6,GVar2,0x9303);
  GVar2 = (*gl->getProgramResourceIndex)(program.m_program.m_program,0x92e5,"Output.values");
  glu::getProgramInterfaceVariableInfo(&valueInfo,gl,program.m_program.m_program,0x92e5,GVar2);
  iVar1 = 0;
  BufferMemMap::BufferMemMap(&bufMap,gl,0x90d2,0,dVar3,1);
  uVar8 = 0;
  if (0 < (int)uVar14) {
    uVar8 = (ulong)uVar14;
  }
  if (iVar15 < 1) {
    iVar15 = 0;
  }
  iVar13 = 1;
  iVar10 = 0;
  do {
    if (iVar10 == iVar15) {
      BufferMemMap::~BufferMemMap(&bufMap);
      std::__cxx11::string::~string((string *)&valueInfo);
      tcu::TestContext::setTestResult
                ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
                 "Pass");
      glu::ShaderProgram::~ShaderProgram(&program);
      std::__cxx11::ostringstream::~ostringstream((ostringstream *)&src);
      glu::ObjectWrapper::~ObjectWrapper(&outputBuffer.super_ObjectWrapper);
      return STOP;
    }
    uVar9 = 0;
    iVar11 = iVar1;
    while (uVar8 != uVar9) {
      lVar12 = (long)iVar11;
      uVar9 = uVar9 + 1;
      iVar11 = iVar11 + valueInfo.arrayStride;
      if ((int)uVar9 != *(int *)((long)bufMap.m_ptr + lVar12 + (ulong)valueInfo.offset)) {
        pTVar7 = (TestError *)__cxa_allocate_exception(0x38);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_418,"Comparison failed for Output.values[",&local_4c1);
        local_4b4 = (int)uVar9 - iVar13;
        de::toString<int>(&local_438,&local_4b4);
        std::operator+(&local_4b0,&local_418,&local_438);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       local_460,&local_4b0,"]");
        tcu::TestError::TestError(pTVar7,(string *)local_460);
        __cxa_throw(pTVar7,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
      }
    }
    iVar10 = iVar10 + 1;
    iVar13 = iVar13 - uVar14;
    iVar1 = iVar1 + uVar14 * valueInfo.arrayStride;
  } while( true );
}

Assistant:

IterateResult iterate (void)
	{
		const glw::Functions&		gl				= m_context.getRenderContext().getFunctions();
		const Buffer				outputBuffer	(m_context.getRenderContext());
		const int					workGroupSize	= m_localSize[0]*m_localSize[1]*m_localSize[2];
		const int					workGroupCount	= m_workSize[0]*m_workSize[1]*m_workSize[2];
		const int					numValues		= workGroupSize*workGroupCount;

		const GLSLVersion			glslVersion		= glu::getContextTypeGLSLVersion(m_context.getRenderContext().getType());
		std::ostringstream			src;

		src << getGLSLVersionDeclaration(glslVersion) << "\n"
			<< "layout (local_size_x = " << m_localSize[0] << ", local_size_y = " << m_localSize[1] << ", local_size_z = " << m_localSize[2] << ") in;\n"
			<< "layout(binding = 0) buffer Output {\n"
			<< "    uint values[" << numValues << "];\n"
			<< "} sb_out;\n\n"
			<< "shared uint count;\n\n"
			<< "void main (void) {\n"
			<< "    uint localSize  = gl_WorkGroupSize.x*gl_WorkGroupSize.y*gl_WorkGroupSize.z;\n"
			<< "    uint globalNdx  = gl_NumWorkGroups.x*gl_NumWorkGroups.y*gl_WorkGroupID.z + gl_NumWorkGroups.x*gl_WorkGroupID.y + gl_WorkGroupID.x;\n"
			<< "    uint globalOffs = localSize*globalNdx;\n"
			<< "\n"
			<< "    count = 0u;\n"
			<< "    barrier();\n"
			<< "    uint oldVal = atomicAdd(count, 1u);\n"
			<< "    sb_out.values[globalOffs+oldVal] = oldVal+1u;\n"
			<< "}\n";

		const ShaderProgram			program			(m_context.getRenderContext(), ProgramSources() << ShaderSource(SHADERTYPE_COMPUTE, src.str()));

		m_testCtx.getLog() << program;
		if (!program.isOk())
			TCU_FAIL("Compile failed");

		m_testCtx.getLog() << TestLog::Message << "Work groups: " << m_workSize << TestLog::EndMessage;

		gl.useProgram(program.getProgram());

		// Output buffer setup
		{
			const deUint32		blockIndex		= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int			blockSize		= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);

			gl.bindBuffer(GL_SHADER_STORAGE_BUFFER, *outputBuffer);
			gl.bufferData(GL_SHADER_STORAGE_BUFFER, blockSize, DE_NULL, GL_STREAM_READ);
			gl.bindBufferBase(GL_SHADER_STORAGE_BUFFER, 0, *outputBuffer);
			GLU_EXPECT_NO_ERROR(gl.getError(), "Output buffer setup failed");
		}

		// Dispatch compute workload
		gl.dispatchCompute(m_workSize[0], m_workSize[1], m_workSize[2]);
		GLU_EXPECT_NO_ERROR(gl.getError(), "glDispatchCompute()");

		// Read back and compare
		{
			const deUint32				blockIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_SHADER_STORAGE_BLOCK, "Output");
			const int					blockSize	= getProgramResourceInt(gl, program.getProgram(), GL_SHADER_STORAGE_BLOCK, blockIndex, GL_BUFFER_DATA_SIZE);
			const deUint32				valueIndex	= gl.getProgramResourceIndex(program.getProgram(), GL_BUFFER_VARIABLE, "Output.values");
			const InterfaceVariableInfo	valueInfo	= getProgramInterfaceVariableInfo(gl, program.getProgram(), GL_BUFFER_VARIABLE, valueIndex);
			const BufferMemMap			bufMap		(gl, GL_SHADER_STORAGE_BUFFER, 0, blockSize, GL_MAP_READ_BIT);

			for (int groupNdx = 0; groupNdx < workGroupCount; groupNdx++)
			{
				for (int localOffs = 0; localOffs < workGroupSize; localOffs++)
				{
					const int		globalOffs	= groupNdx*workGroupSize;
					const deUint32	res			= *((const deUint32*)((const deUint8*)bufMap.getPtr() + valueInfo.offset + valueInfo.arrayStride*(globalOffs + localOffs)));
					const deUint32	ref			= (deUint32)(localOffs+1);

					if (res != ref)
						throw tcu::TestError(string("Comparison failed for Output.values[") + de::toString(globalOffs + localOffs) + "]");
				}
			}
		}

		m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
		return STOP;
	}